

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

Parser * Catch::makeCommandLineParser(ConfigData *config)

{
  StringRef optName;
  StringRef optName_00;
  StringRef optName_01;
  StringRef optName_02;
  StringRef optName_03;
  StringRef optName_04;
  StringRef optName_05;
  StringRef optName_06;
  StringRef optName_07;
  StringRef optName_08;
  StringRef optName_09;
  StringRef optName_10;
  StringRef optName_11;
  StringRef optName_12;
  StringRef optName_13;
  StringRef optName_14;
  StringRef optName_15;
  StringRef optName_16;
  StringRef optName_17;
  StringRef optName_18;
  StringRef optName_19;
  StringRef optName_20;
  StringRef optName_21;
  StringRef optName_22;
  StringRef optName_23;
  StringRef optName_24;
  StringRef optName_25;
  StringRef optName_26;
  StringRef optName_27;
  StringRef optName_28;
  StringRef optName_29;
  StringRef optName_30;
  StringRef optName_31;
  StringRef optName_32;
  StringRef optName_33;
  StringRef optName_34;
  StringRef optName_35;
  StringRef optName_36;
  StringRef optName_37;
  StringRef optName_38;
  StringRef optName_39;
  StringRef optName_40;
  StringRef optName_41;
  StringRef optName_42;
  StringRef optName_43;
  StringRef optName_44;
  StringRef optName_45;
  StringRef optName_46;
  StringRef optName_47;
  StringRef optName_48;
  StringRef SVar1;
  StringRef hint;
  StringRef hint_00;
  StringRef hint_01;
  StringRef hint_02;
  StringRef hint_03;
  StringRef hint_04;
  StringRef hint_05;
  StringRef hint_06;
  StringRef hint_07;
  StringRef hint_08;
  StringRef hint_09;
  StringRef hint_10;
  StringRef hint_11;
  StringRef hint_12;
  StringRef hint_13;
  StringRef hint_14;
  StringRef hint_15;
  StringRef hint_16;
  Opt *pOVar2;
  Opt *this;
  Opt *this_00;
  Parser *p;
  Parser *this_01;
  long in_RSI;
  Parser *in_RDI;
  anon_class_8_1_50637480_for_m_lambda setShardIndex;
  anon_class_8_1_50637480_for_m_lambda setShardCount;
  anon_class_8_1_50637480_for_m_lambda setReporter;
  anon_class_8_1_50637480_for_m_lambda setVerbosity;
  anon_class_8_1_50637480_for_m_lambda setWaitForKeypress;
  anon_class_8_1_50637480_for_m_lambda setDefaultColourMode;
  anon_class_8_1_50637480_for_m_lambda setRngSeed;
  anon_class_8_1_50637480_for_m_lambda setTestOrder;
  anon_class_8_1_50637480_for_m_lambda loadTestNamesFromFile;
  anon_class_8_1_50637480_for_m_lambda setWarning;
  Parser *cli;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffdc28;
  Opt *in_stack_ffffffffffffdc30;
  Parser *in_stack_ffffffffffffdc38;
  Opt *in_stack_ffffffffffffdc40;
  string *in_stack_ffffffffffffdc48;
  Opt *in_stack_ffffffffffffdc50;
  bool *in_stack_ffffffffffffdc68;
  Opt *in_stack_ffffffffffffdc70;
  bool *in_stack_ffffffffffffdca8;
  Help *in_stack_ffffffffffffdcb0;
  Help *in_stack_ffffffffffffdd10;
  ComposableParserImpl<Catch::Clara::ExeName> *in_stack_ffffffffffffdd18;
  StringRef local_20d0;
  ParserRefImpl<Catch::Clara::Arg> local_20b0;
  StringRef local_2070;
  StringRef local_1ff8;
  StringRef local_1f70;
  StringRef local_1ee8;
  StringRef local_1e60;
  StringRef local_1de8;
  StringRef local_1d60;
  StringRef local_1cd8;
  StringRef local_1c50;
  StringRef local_1bd8;
  StringRef local_1b50;
  StringRef local_1ad8;
  StringRef local_1a50;
  StringRef local_19c8;
  StringRef local_1940;
  StringRef local_18c8;
  StringRef local_1850;
  StringRef local_17d8;
  StringRef local_1760;
  StringRef local_16c8;
  StringRef local_1630;
  StringRef local_15a8;
  StringRef local_1510;
  StringRef local_1478;
  long local_1438;
  StringRef local_13d8;
  undefined8 local_13a8;
  undefined8 local_13a0;
  Opt local_1390;
  StringRef local_1338;
  long local_12f8;
  StringRef local_1298;
  long local_1268;
  StringRef local_1208;
  StringRef local_1170;
  undefined8 local_1140;
  undefined8 local_1138;
  Opt local_1128;
  StringRef local_10d0;
  StringRef local_1038;
  StringRef local_fb0;
  StringRef local_f28;
  StringRef local_ea0;
  undefined1 local_61;
  undefined1 local_50 [56];
  undefined1 local_18 [8];
  long local_10;
  
  local_61 = 0;
  local_10 = in_RSI;
  Clara::ExeName::ExeName((ExeName *)in_stack_ffffffffffffdc50,in_stack_ffffffffffffdc48);
  Clara::Help::Help(in_stack_ffffffffffffdcb0,in_stack_ffffffffffffdca8);
  Clara::Detail::ComposableParserImpl<Catch::Clara::ExeName>::operator|
            (in_stack_ffffffffffffdd18,in_stack_ffffffffffffdd10);
  Clara::Opt::Opt(in_stack_ffffffffffffdc70,in_stack_ffffffffffffdc68);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  optName.m_size = (size_type)in_stack_ffffffffffffdc40;
  optName.m_start = (char *)in_stack_ffffffffffffdc38;
  Clara::Opt::operator[](in_stack_ffffffffffffdc30,optName);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  optName_00.m_size = (size_type)in_stack_ffffffffffffdc40;
  optName_00.m_start = (char *)in_stack_ffffffffffffdc38;
  pOVar2 = Clara::Opt::operator[](in_stack_ffffffffffffdc30,optName_00);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  Clara::Detail::ParserRefImpl<Catch::Clara::Opt>::operator()
            (&pOVar2->super_ParserRefImpl<Catch::Clara::Opt>,local_ea0);
  Clara::operator|(in_stack_ffffffffffffdc38,in_stack_ffffffffffffdc30);
  Clara::Opt::Opt(in_stack_ffffffffffffdc70,in_stack_ffffffffffffdc68);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  optName_01.m_size = (size_type)in_stack_ffffffffffffdc40;
  optName_01.m_start = (char *)in_stack_ffffffffffffdc38;
  Clara::Opt::operator[](in_stack_ffffffffffffdc30,optName_01);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  optName_02.m_size = (size_type)in_stack_ffffffffffffdc40;
  optName_02.m_start = (char *)in_stack_ffffffffffffdc38;
  pOVar2 = Clara::Opt::operator[](in_stack_ffffffffffffdc30,optName_02);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  Clara::Detail::ParserRefImpl<Catch::Clara::Opt>::operator()
            (&pOVar2->super_ParserRefImpl<Catch::Clara::Opt>,local_f28);
  Clara::operator|(in_stack_ffffffffffffdc38,in_stack_ffffffffffffdc30);
  Clara::Opt::Opt(in_stack_ffffffffffffdc70,in_stack_ffffffffffffdc68);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  optName_03.m_size = (size_type)in_stack_ffffffffffffdc40;
  optName_03.m_start = (char *)in_stack_ffffffffffffdc38;
  Clara::Opt::operator[](in_stack_ffffffffffffdc30,optName_03);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  optName_04.m_size = (size_type)in_stack_ffffffffffffdc40;
  optName_04.m_start = (char *)in_stack_ffffffffffffdc38;
  pOVar2 = Clara::Opt::operator[](in_stack_ffffffffffffdc30,optName_04);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  Clara::Detail::ParserRefImpl<Catch::Clara::Opt>::operator()
            (&pOVar2->super_ParserRefImpl<Catch::Clara::Opt>,local_fb0);
  Clara::operator|(in_stack_ffffffffffffdc38,in_stack_ffffffffffffdc30);
  Clara::Opt::Opt(in_stack_ffffffffffffdc70,in_stack_ffffffffffffdc68);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  optName_05.m_size = (size_type)in_stack_ffffffffffffdc40;
  optName_05.m_start = (char *)in_stack_ffffffffffffdc38;
  Clara::Opt::operator[](in_stack_ffffffffffffdc30,optName_05);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  optName_06.m_size = (size_type)in_stack_ffffffffffffdc40;
  optName_06.m_start = (char *)in_stack_ffffffffffffdc38;
  pOVar2 = Clara::Opt::operator[](in_stack_ffffffffffffdc30,optName_06);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  Clara::Detail::ParserRefImpl<Catch::Clara::Opt>::operator()
            (&pOVar2->super_ParserRefImpl<Catch::Clara::Opt>,local_1038);
  Clara::operator|(in_stack_ffffffffffffdc38,in_stack_ffffffffffffdc30);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  hint.m_size = (size_type)in_stack_ffffffffffffdc50;
  hint.m_start = (char *)in_stack_ffffffffffffdc48;
  Clara::Opt::Opt<std::__cxx11::string,void>
            (in_stack_ffffffffffffdc40,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffdc38,hint);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  optName_07.m_size = (size_type)in_stack_ffffffffffffdc40;
  optName_07.m_start = (char *)in_stack_ffffffffffffdc38;
  Clara::Opt::operator[](in_stack_ffffffffffffdc30,optName_07);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  optName_08.m_size = (size_type)in_stack_ffffffffffffdc40;
  optName_08.m_start = (char *)in_stack_ffffffffffffdc38;
  pOVar2 = Clara::Opt::operator[](in_stack_ffffffffffffdc30,optName_08);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  Clara::Detail::ParserRefImpl<Catch::Clara::Opt>::operator()
            (&pOVar2->super_ParserRefImpl<Catch::Clara::Opt>,local_10d0);
  Clara::operator|(in_stack_ffffffffffffdc38,in_stack_ffffffffffffdc30);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  Clara::Opt::Opt<Catch::makeCommandLineParser(Catch::ConfigData&)::__0>
            (&local_1128,local_50,local_1140,local_1138);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  optName_09.m_size = (size_type)in_stack_ffffffffffffdc40;
  optName_09.m_start = (char *)in_stack_ffffffffffffdc38;
  Clara::Opt::operator[](in_stack_ffffffffffffdc30,optName_09);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  optName_10.m_size = (size_type)in_stack_ffffffffffffdc40;
  optName_10.m_start = (char *)in_stack_ffffffffffffdc38;
  pOVar2 = Clara::Opt::operator[](in_stack_ffffffffffffdc30,optName_10);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  Clara::Detail::ParserRefImpl<Catch::Clara::Opt>::operator()
            (&pOVar2->super_ParserRefImpl<Catch::Clara::Opt>,local_1170);
  Clara::operator|(in_stack_ffffffffffffdc38,in_stack_ffffffffffffdc30);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  hint_00.m_size = (size_type)in_stack_ffffffffffffdc50;
  hint_00.m_start = (char *)in_stack_ffffffffffffdc48;
  Clara::Opt::Opt<std::__cxx11::string,void>
            (in_stack_ffffffffffffdc40,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffdc38,hint_00);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  optName_11.m_size = (size_type)in_stack_ffffffffffffdc40;
  optName_11.m_start = (char *)in_stack_ffffffffffffdc38;
  Clara::Opt::operator[](in_stack_ffffffffffffdc30,optName_11);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  optName_12.m_size = (size_type)in_stack_ffffffffffffdc40;
  optName_12.m_start = (char *)in_stack_ffffffffffffdc38;
  pOVar2 = Clara::Opt::operator[](in_stack_ffffffffffffdc30,optName_12);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  Clara::Detail::ParserRefImpl<Catch::Clara::Opt>::operator()
            (&pOVar2->super_ParserRefImpl<Catch::Clara::Opt>,local_1208);
  Clara::operator|(in_stack_ffffffffffffdc38,in_stack_ffffffffffffdc30);
  local_1268 = local_10;
  Clara::Opt::Opt<Catch::makeCommandLineParser(Catch::ConfigData&)::__1>
            (in_stack_ffffffffffffdc50,
             (anon_class_8_1_50637480_for_m_lambda *)in_stack_ffffffffffffdc48);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  optName_13.m_size = (size_type)in_stack_ffffffffffffdc40;
  optName_13.m_start = (char *)in_stack_ffffffffffffdc38;
  Clara::Opt::operator[](in_stack_ffffffffffffdc30,optName_13);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  optName_14.m_size = (size_type)in_stack_ffffffffffffdc40;
  optName_14.m_start = (char *)in_stack_ffffffffffffdc38;
  pOVar2 = Clara::Opt::operator[](in_stack_ffffffffffffdc30,optName_14);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  Clara::Detail::ParserRefImpl<Catch::Clara::Opt>::operator()
            (&pOVar2->super_ParserRefImpl<Catch::Clara::Opt>,local_1298);
  Clara::operator|(in_stack_ffffffffffffdc38,in_stack_ffffffffffffdc30);
  local_12f8 = local_10;
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  hint_01.m_size = (size_type)in_stack_ffffffffffffdc50;
  hint_01.m_start = (char *)in_stack_ffffffffffffdc48;
  Clara::Opt::Opt<Catch::makeCommandLineParser(Catch::ConfigData&)::__2,void>
            (in_stack_ffffffffffffdc40,
             (anon_class_8_1_50637480_for_m_lambda *)in_stack_ffffffffffffdc38,hint_01);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  optName_15.m_size = (size_type)in_stack_ffffffffffffdc40;
  optName_15.m_start = (char *)in_stack_ffffffffffffdc38;
  Clara::Opt::operator[](in_stack_ffffffffffffdc30,optName_15);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  optName_16.m_size = (size_type)in_stack_ffffffffffffdc40;
  optName_16.m_start = (char *)in_stack_ffffffffffffdc38;
  pOVar2 = Clara::Opt::operator[](in_stack_ffffffffffffdc30,optName_16);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  Clara::Detail::ParserRefImpl<Catch::Clara::Opt>::operator()
            (&pOVar2->super_ParserRefImpl<Catch::Clara::Opt>,local_1338);
  Clara::operator|(in_stack_ffffffffffffdc38,in_stack_ffffffffffffdc30);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  Clara::Opt::Opt<Catch::makeCommandLineParser(Catch::ConfigData&)::__3>
            (&local_1390,local_18,local_13a8,local_13a0);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  optName_17.m_size = (size_type)in_stack_ffffffffffffdc40;
  optName_17.m_start = (char *)in_stack_ffffffffffffdc38;
  Clara::Opt::operator[](in_stack_ffffffffffffdc30,optName_17);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  optName_18.m_size = (size_type)in_stack_ffffffffffffdc40;
  optName_18.m_start = (char *)in_stack_ffffffffffffdc38;
  pOVar2 = Clara::Opt::operator[](in_stack_ffffffffffffdc30,optName_18);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  Clara::Detail::ParserRefImpl<Catch::Clara::Opt>::operator()
            (&pOVar2->super_ParserRefImpl<Catch::Clara::Opt>,local_13d8);
  Clara::operator|(in_stack_ffffffffffffdc38,in_stack_ffffffffffffdc30);
  local_1438 = local_10;
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  hint_02.m_size = (size_type)in_stack_ffffffffffffdc50;
  hint_02.m_start = (char *)in_stack_ffffffffffffdc48;
  Clara::Opt::Opt<Catch::makeCommandLineParser(Catch::ConfigData&)::__4,void>
            (in_stack_ffffffffffffdc40,
             (anon_class_8_1_50637480_for_m_lambda *)in_stack_ffffffffffffdc38,hint_02);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  optName_19.m_size = (size_type)in_stack_ffffffffffffdc40;
  optName_19.m_start = (char *)in_stack_ffffffffffffdc38;
  Clara::Opt::operator[](in_stack_ffffffffffffdc30,optName_19);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  optName_20.m_size = (size_type)in_stack_ffffffffffffdc40;
  optName_20.m_start = (char *)in_stack_ffffffffffffdc38;
  pOVar2 = Clara::Opt::operator[](in_stack_ffffffffffffdc30,optName_20);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  Clara::Detail::ParserRefImpl<Catch::Clara::Opt>::operator()
            (&pOVar2->super_ParserRefImpl<Catch::Clara::Opt>,local_1478);
  Clara::operator|(in_stack_ffffffffffffdc38,in_stack_ffffffffffffdc30);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  hint_03.m_size = (size_type)in_stack_ffffffffffffdc50;
  hint_03.m_start = (char *)in_stack_ffffffffffffdc48;
  Clara::Opt::Opt<double,void>
            (in_stack_ffffffffffffdc40,(double *)in_stack_ffffffffffffdc38,hint_03);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  optName_21.m_size = (size_type)in_stack_ffffffffffffdc40;
  optName_21.m_start = (char *)in_stack_ffffffffffffdc38;
  Clara::Opt::operator[](in_stack_ffffffffffffdc30,optName_21);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  optName_22.m_size = (size_type)in_stack_ffffffffffffdc40;
  optName_22.m_start = (char *)in_stack_ffffffffffffdc38;
  pOVar2 = Clara::Opt::operator[](in_stack_ffffffffffffdc30,optName_22);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  Clara::Detail::ParserRefImpl<Catch::Clara::Opt>::operator()
            (&pOVar2->super_ParserRefImpl<Catch::Clara::Opt>,local_1510);
  Clara::operator|(in_stack_ffffffffffffdc38,in_stack_ffffffffffffdc30);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  hint_04.m_size = (size_type)in_stack_ffffffffffffdc50;
  hint_04.m_start = (char *)in_stack_ffffffffffffdc48;
  Clara::Opt::Opt<Catch::makeCommandLineParser(Catch::ConfigData&)::__5,void>
            (in_stack_ffffffffffffdc40,
             (anon_class_8_1_50637480_for_m_lambda *)in_stack_ffffffffffffdc38,hint_04);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  optName_23.m_size = (size_type)in_stack_ffffffffffffdc40;
  optName_23.m_start = (char *)in_stack_ffffffffffffdc38;
  Clara::Opt::operator[](in_stack_ffffffffffffdc30,optName_23);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  optName_24.m_size = (size_type)in_stack_ffffffffffffdc40;
  optName_24.m_start = (char *)in_stack_ffffffffffffdc38;
  pOVar2 = Clara::Opt::operator[](in_stack_ffffffffffffdc30,optName_24);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  Clara::Detail::ParserRefImpl<Catch::Clara::Opt>::operator()
            (&pOVar2->super_ParserRefImpl<Catch::Clara::Opt>,local_15a8);
  Clara::operator|(in_stack_ffffffffffffdc38,in_stack_ffffffffffffdc30);
  Clara::Opt::Opt(in_stack_ffffffffffffdc70,in_stack_ffffffffffffdc68);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  optName_25.m_size = (size_type)in_stack_ffffffffffffdc40;
  optName_25.m_start = (char *)in_stack_ffffffffffffdc38;
  Clara::Opt::operator[](in_stack_ffffffffffffdc30,optName_25);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  optName_26.m_size = (size_type)in_stack_ffffffffffffdc40;
  optName_26.m_start = (char *)in_stack_ffffffffffffdc38;
  pOVar2 = Clara::Opt::operator[](in_stack_ffffffffffffdc30,optName_26);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  Clara::Detail::ParserRefImpl<Catch::Clara::Opt>::operator()
            (&pOVar2->super_ParserRefImpl<Catch::Clara::Opt>,local_1630);
  Clara::operator|(in_stack_ffffffffffffdc38,in_stack_ffffffffffffdc30);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  hint_05.m_size = (size_type)in_stack_ffffffffffffdc50;
  hint_05.m_start = (char *)in_stack_ffffffffffffdc48;
  Clara::Opt::Opt<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,void>
            (in_stack_ffffffffffffdc40,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_ffffffffffffdc38,hint_05);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  optName_27.m_size = (size_type)in_stack_ffffffffffffdc40;
  optName_27.m_start = (char *)in_stack_ffffffffffffdc38;
  Clara::Opt::operator[](in_stack_ffffffffffffdc30,optName_27);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  optName_28.m_size = (size_type)in_stack_ffffffffffffdc40;
  optName_28.m_start = (char *)in_stack_ffffffffffffdc38;
  pOVar2 = Clara::Opt::operator[](in_stack_ffffffffffffdc30,optName_28);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  Clara::Detail::ParserRefImpl<Catch::Clara::Opt>::operator()
            (&pOVar2->super_ParserRefImpl<Catch::Clara::Opt>,local_16c8);
  Clara::operator|(in_stack_ffffffffffffdc38,in_stack_ffffffffffffdc30);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  hint_06.m_size = (size_type)in_stack_ffffffffffffdc50;
  hint_06.m_start = (char *)in_stack_ffffffffffffdc48;
  Clara::Opt::Opt<Catch::makeCommandLineParser(Catch::ConfigData&)::__6,void>
            (in_stack_ffffffffffffdc40,
             (anon_class_8_1_50637480_for_m_lambda *)in_stack_ffffffffffffdc38,hint_06);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  optName_29.m_size = (size_type)in_stack_ffffffffffffdc40;
  optName_29.m_start = (char *)in_stack_ffffffffffffdc38;
  Clara::Opt::operator[](in_stack_ffffffffffffdc30,optName_29);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  optName_30.m_size = (size_type)in_stack_ffffffffffffdc40;
  optName_30.m_start = (char *)in_stack_ffffffffffffdc38;
  pOVar2 = Clara::Opt::operator[](in_stack_ffffffffffffdc30,optName_30);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  Clara::Detail::ParserRefImpl<Catch::Clara::Opt>::operator()
            (&pOVar2->super_ParserRefImpl<Catch::Clara::Opt>,local_1760);
  Clara::operator|(in_stack_ffffffffffffdc38,in_stack_ffffffffffffdc30);
  Clara::Opt::Opt(in_stack_ffffffffffffdc70,in_stack_ffffffffffffdc68);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  optName_31.m_size = (size_type)in_stack_ffffffffffffdc40;
  optName_31.m_start = (char *)in_stack_ffffffffffffdc38;
  pOVar2 = Clara::Opt::operator[](in_stack_ffffffffffffdc30,optName_31);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  Clara::Detail::ParserRefImpl<Catch::Clara::Opt>::operator()
            (&pOVar2->super_ParserRefImpl<Catch::Clara::Opt>,local_17d8);
  Clara::operator|(in_stack_ffffffffffffdc38,in_stack_ffffffffffffdc30);
  Clara::Opt::Opt(in_stack_ffffffffffffdc70,in_stack_ffffffffffffdc68);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  optName_32.m_size = (size_type)in_stack_ffffffffffffdc40;
  optName_32.m_start = (char *)in_stack_ffffffffffffdc38;
  pOVar2 = Clara::Opt::operator[](in_stack_ffffffffffffdc30,optName_32);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  Clara::Detail::ParserRefImpl<Catch::Clara::Opt>::operator()
            (&pOVar2->super_ParserRefImpl<Catch::Clara::Opt>,local_1850);
  Clara::operator|(in_stack_ffffffffffffdc38,in_stack_ffffffffffffdc30);
  Clara::Opt::Opt(in_stack_ffffffffffffdc70,in_stack_ffffffffffffdc68);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  optName_33.m_size = (size_type)in_stack_ffffffffffffdc40;
  optName_33.m_start = (char *)in_stack_ffffffffffffdc38;
  pOVar2 = Clara::Opt::operator[](in_stack_ffffffffffffdc30,optName_33);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  Clara::Detail::ParserRefImpl<Catch::Clara::Opt>::operator()
            (&pOVar2->super_ParserRefImpl<Catch::Clara::Opt>,local_18c8);
  Clara::operator|(in_stack_ffffffffffffdc38,in_stack_ffffffffffffdc30);
  Clara::Opt::Opt(in_stack_ffffffffffffdc70,in_stack_ffffffffffffdc68);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  optName_34.m_size = (size_type)in_stack_ffffffffffffdc40;
  optName_34.m_start = (char *)in_stack_ffffffffffffdc38;
  pOVar2 = Clara::Opt::operator[](in_stack_ffffffffffffdc30,optName_34);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  Clara::Detail::ParserRefImpl<Catch::Clara::Opt>::operator()
            (&pOVar2->super_ParserRefImpl<Catch::Clara::Opt>,local_1940);
  Clara::operator|(in_stack_ffffffffffffdc38,in_stack_ffffffffffffdc30);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  hint_07.m_size = (size_type)in_stack_ffffffffffffdc50;
  hint_07.m_start = (char *)in_stack_ffffffffffffdc48;
  Clara::Opt::Opt<Catch::makeCommandLineParser(Catch::ConfigData&)::__7,void>
            (in_stack_ffffffffffffdc40,
             (anon_class_8_1_50637480_for_m_lambda *)in_stack_ffffffffffffdc38,hint_07);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  optName_35.m_size = (size_type)in_stack_ffffffffffffdc40;
  optName_35.m_start = (char *)in_stack_ffffffffffffdc38;
  pOVar2 = Clara::Opt::operator[](in_stack_ffffffffffffdc30,optName_35);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  Clara::Detail::ParserRefImpl<Catch::Clara::Opt>::operator()
            (&pOVar2->super_ParserRefImpl<Catch::Clara::Opt>,local_19c8);
  Clara::operator|(in_stack_ffffffffffffdc38,in_stack_ffffffffffffdc30);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  hint_08.m_size = (size_type)in_stack_ffffffffffffdc50;
  hint_08.m_start = (char *)in_stack_ffffffffffffdc48;
  Clara::Opt::Opt<Catch::makeCommandLineParser(Catch::ConfigData&)::__8,void>
            (in_stack_ffffffffffffdc40,
             (anon_class_8_1_50637480_for_m_lambda *)in_stack_ffffffffffffdc38,hint_08);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  optName_36.m_size = (size_type)in_stack_ffffffffffffdc40;
  optName_36.m_start = (char *)in_stack_ffffffffffffdc38;
  pOVar2 = Clara::Opt::operator[](in_stack_ffffffffffffdc30,optName_36);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  Clara::Detail::ParserRefImpl<Catch::Clara::Opt>::operator()
            (&pOVar2->super_ParserRefImpl<Catch::Clara::Opt>,local_1a50);
  Clara::operator|(in_stack_ffffffffffffdc38,in_stack_ffffffffffffdc30);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  hint_09.m_size = (size_type)in_stack_ffffffffffffdc50;
  hint_09.m_start = (char *)in_stack_ffffffffffffdc48;
  Clara::Opt::Opt<Catch::makeCommandLineParser(Catch::ConfigData&)::__9,void>
            (in_stack_ffffffffffffdc40,
             (anon_class_8_1_50637480_for_m_lambda *)in_stack_ffffffffffffdc38,hint_09);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  optName_37.m_size = (size_type)in_stack_ffffffffffffdc40;
  optName_37.m_start = (char *)in_stack_ffffffffffffdc38;
  pOVar2 = Clara::Opt::operator[](in_stack_ffffffffffffdc30,optName_37);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  Clara::Detail::ParserRefImpl<Catch::Clara::Opt>::operator()
            (&pOVar2->super_ParserRefImpl<Catch::Clara::Opt>,local_1ad8);
  Clara::operator|(in_stack_ffffffffffffdc38,in_stack_ffffffffffffdc30);
  Clara::Opt::Opt(in_stack_ffffffffffffdc70,in_stack_ffffffffffffdc68);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  optName_38.m_size = (size_type)in_stack_ffffffffffffdc40;
  optName_38.m_start = (char *)in_stack_ffffffffffffdc38;
  pOVar2 = Clara::Opt::operator[](in_stack_ffffffffffffdc30,optName_38);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  Clara::Detail::ParserRefImpl<Catch::Clara::Opt>::operator()
            (&pOVar2->super_ParserRefImpl<Catch::Clara::Opt>,local_1b50);
  Clara::operator|(in_stack_ffffffffffffdc38,in_stack_ffffffffffffdc30);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  hint_10.m_size = (size_type)in_stack_ffffffffffffdc50;
  hint_10.m_start = (char *)in_stack_ffffffffffffdc48;
  Clara::Opt::Opt<Catch::makeCommandLineParser(Catch::ConfigData&)::__10,void>
            (in_stack_ffffffffffffdc40,
             (anon_class_8_1_50637480_for_m_lambda *)in_stack_ffffffffffffdc38,hint_10);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  optName_39.m_size = (size_type)in_stack_ffffffffffffdc40;
  optName_39.m_start = (char *)in_stack_ffffffffffffdc38;
  pOVar2 = Clara::Opt::operator[](in_stack_ffffffffffffdc30,optName_39);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  Clara::Detail::ParserRefImpl<Catch::Clara::Opt>::operator()
            (&pOVar2->super_ParserRefImpl<Catch::Clara::Opt>,local_1bd8);
  Clara::operator|(in_stack_ffffffffffffdc38,in_stack_ffffffffffffdc30);
  Clara::Opt::Opt(in_stack_ffffffffffffdc70,in_stack_ffffffffffffdc68);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  optName_40.m_size = (size_type)in_stack_ffffffffffffdc40;
  optName_40.m_start = (char *)in_stack_ffffffffffffdc38;
  pOVar2 = Clara::Opt::operator[](in_stack_ffffffffffffdc30,optName_40);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  Clara::Detail::ParserRefImpl<Catch::Clara::Opt>::operator()
            (&pOVar2->super_ParserRefImpl<Catch::Clara::Opt>,local_1c50);
  Clara::operator|(in_stack_ffffffffffffdc38,in_stack_ffffffffffffdc30);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  hint_11.m_size = (size_type)in_stack_ffffffffffffdc50;
  hint_11.m_start = (char *)in_stack_ffffffffffffdc48;
  Clara::Opt::Opt<unsigned_int,void>
            (in_stack_ffffffffffffdc40,(uint *)in_stack_ffffffffffffdc38,hint_11);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  optName_41.m_size = (size_type)in_stack_ffffffffffffdc40;
  optName_41.m_start = (char *)in_stack_ffffffffffffdc38;
  pOVar2 = Clara::Opt::operator[](in_stack_ffffffffffffdc30,optName_41);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  Clara::Detail::ParserRefImpl<Catch::Clara::Opt>::operator()
            (&pOVar2->super_ParserRefImpl<Catch::Clara::Opt>,local_1cd8);
  Clara::operator|(in_stack_ffffffffffffdc38,in_stack_ffffffffffffdc30);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  hint_12.m_size = (size_type)in_stack_ffffffffffffdc50;
  hint_12.m_start = (char *)in_stack_ffffffffffffdc48;
  Clara::Opt::Opt<unsigned_int,void>
            (in_stack_ffffffffffffdc40,(uint *)in_stack_ffffffffffffdc38,hint_12);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  optName_42.m_size = (size_type)in_stack_ffffffffffffdc40;
  optName_42.m_start = (char *)in_stack_ffffffffffffdc38;
  pOVar2 = Clara::Opt::operator[](in_stack_ffffffffffffdc30,optName_42);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  Clara::Detail::ParserRefImpl<Catch::Clara::Opt>::operator()
            (&pOVar2->super_ParserRefImpl<Catch::Clara::Opt>,local_1d60);
  Clara::operator|(in_stack_ffffffffffffdc38,in_stack_ffffffffffffdc30);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  hint_13.m_size = (size_type)in_stack_ffffffffffffdc50;
  hint_13.m_start = (char *)in_stack_ffffffffffffdc48;
  Clara::Opt::Opt<double,void>
            (in_stack_ffffffffffffdc40,(double *)in_stack_ffffffffffffdc38,hint_13);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  optName_43.m_size = (size_type)in_stack_ffffffffffffdc40;
  optName_43.m_start = (char *)in_stack_ffffffffffffdc38;
  pOVar2 = Clara::Opt::operator[](in_stack_ffffffffffffdc30,optName_43);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  Clara::Detail::ParserRefImpl<Catch::Clara::Opt>::operator()
            (&pOVar2->super_ParserRefImpl<Catch::Clara::Opt>,local_1de8);
  Clara::operator|(in_stack_ffffffffffffdc38,in_stack_ffffffffffffdc30);
  Clara::Opt::Opt(in_stack_ffffffffffffdc70,in_stack_ffffffffffffdc68);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  optName_44.m_size = (size_type)in_stack_ffffffffffffdc40;
  optName_44.m_start = (char *)in_stack_ffffffffffffdc38;
  pOVar2 = Clara::Opt::operator[](in_stack_ffffffffffffdc30,optName_44);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  Clara::Detail::ParserRefImpl<Catch::Clara::Opt>::operator()
            (&pOVar2->super_ParserRefImpl<Catch::Clara::Opt>,local_1e60);
  Clara::operator|(in_stack_ffffffffffffdc38,in_stack_ffffffffffffdc30);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  hint_14.m_size = (size_type)in_stack_ffffffffffffdc50;
  hint_14.m_start = (char *)in_stack_ffffffffffffdc48;
  Clara::Opt::Opt<long,void>(in_stack_ffffffffffffdc40,(long *)in_stack_ffffffffffffdc38,hint_14);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  optName_45.m_size = (size_type)in_stack_ffffffffffffdc40;
  optName_45.m_start = (char *)in_stack_ffffffffffffdc38;
  pOVar2 = Clara::Opt::operator[](in_stack_ffffffffffffdc30,optName_45);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  pOVar2 = Clara::Detail::ParserRefImpl<Catch::Clara::Opt>::operator()
                     (&pOVar2->super_ParserRefImpl<Catch::Clara::Opt>,local_1ee8);
  Clara::operator|(in_stack_ffffffffffffdc38,in_stack_ffffffffffffdc30);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  hint_15.m_size = (size_type)in_stack_ffffffffffffdc50;
  hint_15.m_start = (char *)in_stack_ffffffffffffdc48;
  Clara::Opt::Opt<Catch::makeCommandLineParser(Catch::ConfigData&)::__11,void>
            (in_stack_ffffffffffffdc40,
             (anon_class_8_1_50637480_for_m_lambda *)in_stack_ffffffffffffdc38,hint_15);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  optName_46.m_size = (size_type)in_stack_ffffffffffffdc40;
  optName_46.m_start = (char *)in_stack_ffffffffffffdc38;
  this = Clara::Opt::operator[](in_stack_ffffffffffffdc30,optName_46);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  Clara::Detail::ParserRefImpl<Catch::Clara::Opt>::operator()
            (&this->super_ParserRefImpl<Catch::Clara::Opt>,local_1f70);
  Clara::operator|(in_stack_ffffffffffffdc38,in_stack_ffffffffffffdc30);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  hint_16.m_size = (size_type)in_stack_ffffffffffffdc50;
  hint_16.m_start = (char *)in_stack_ffffffffffffdc48;
  Clara::Opt::Opt<Catch::makeCommandLineParser(Catch::ConfigData&)::__12,void>
            (in_stack_ffffffffffffdc40,
             (anon_class_8_1_50637480_for_m_lambda *)in_stack_ffffffffffffdc38,hint_16);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  optName_47.m_size = (size_type)in_stack_ffffffffffffdc40;
  optName_47.m_start = (char *)in_stack_ffffffffffffdc38;
  this_00 = Clara::Opt::operator[](in_stack_ffffffffffffdc30,optName_47);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  Clara::Detail::ParserRefImpl<Catch::Clara::Opt>::operator()
            (&this_00->super_ParserRefImpl<Catch::Clara::Opt>,local_1ff8);
  Clara::operator|(in_stack_ffffffffffffdc38,in_stack_ffffffffffffdc30);
  Clara::Opt::Opt(pOVar2,(bool *)this);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  optName_48.m_size = (size_type)in_stack_ffffffffffffdc40;
  optName_48.m_start = (char *)in_stack_ffffffffffffdc38;
  pOVar2 = Clara::Opt::operator[](in_stack_ffffffffffffdc30,optName_48);
  StringRef::StringRef((StringRef *)in_stack_ffffffffffffdc40,(char *)in_stack_ffffffffffffdc38);
  pOVar2 = Clara::Detail::ParserRefImpl<Catch::Clara::Opt>::operator()
                     (&pOVar2->super_ParserRefImpl<Catch::Clara::Opt>,local_2070);
  Clara::operator|(in_stack_ffffffffffffdc38,in_stack_ffffffffffffdc30);
  p = (Parser *)(local_10 + 0xe0);
  StringRef::StringRef((StringRef *)pOVar2,(char *)p);
  SVar1.m_size = (size_type)pOVar2;
  SVar1.m_start = (char *)p;
  Clara::Arg::
  ParserRefImpl<std::vector<std::__cxx11::string,std::allocator<std::char_traits<char>>>,void>
            ((Arg *)in_stack_ffffffffffffdc30,in_stack_ffffffffffffdc28,SVar1);
  StringRef::StringRef((StringRef *)pOVar2,(char *)p);
  this_01 = (Parser *)
            Clara::Detail::ParserRefImpl<Catch::Clara::Arg>::operator()(&local_20b0,local_20d0);
  Clara::operator|(p,(Arg *)this_01);
  Clara::Arg::~Arg((Arg *)0x17d261);
  Clara::Parser::~Parser(this_01);
  Clara::Opt::~Opt((Opt *)this_01);
  Clara::Parser::~Parser(this_01);
  Clara::Opt::~Opt((Opt *)this_01);
  Clara::Parser::~Parser(this_01);
  Clara::Opt::~Opt((Opt *)this_01);
  Clara::Parser::~Parser(this_01);
  Clara::Opt::~Opt((Opt *)this_01);
  Clara::Parser::~Parser(this_01);
  Clara::Opt::~Opt((Opt *)this_01);
  Clara::Parser::~Parser(this_01);
  Clara::Opt::~Opt((Opt *)this_01);
  Clara::Parser::~Parser(this_01);
  Clara::Opt::~Opt((Opt *)this_01);
  Clara::Parser::~Parser(this_01);
  Clara::Opt::~Opt((Opt *)this_01);
  Clara::Parser::~Parser(this_01);
  Clara::Opt::~Opt((Opt *)this_01);
  Clara::Parser::~Parser(this_01);
  Clara::Opt::~Opt((Opt *)this_01);
  Clara::Parser::~Parser(this_01);
  Clara::Opt::~Opt((Opt *)this_01);
  Clara::Parser::~Parser(this_01);
  Clara::Opt::~Opt((Opt *)this_01);
  Clara::Parser::~Parser(this_01);
  Clara::Opt::~Opt((Opt *)this_01);
  Clara::Parser::~Parser(this_01);
  Clara::Opt::~Opt((Opt *)this_01);
  Clara::Parser::~Parser(this_01);
  Clara::Opt::~Opt((Opt *)this_01);
  Clara::Parser::~Parser(this_01);
  Clara::Opt::~Opt((Opt *)this_01);
  Clara::Parser::~Parser(this_01);
  Clara::Opt::~Opt((Opt *)this_01);
  Clara::Parser::~Parser(this_01);
  Clara::Opt::~Opt((Opt *)this_01);
  Clara::Parser::~Parser(this_01);
  Clara::Opt::~Opt((Opt *)this_01);
  Clara::Parser::~Parser(this_01);
  Clara::Opt::~Opt((Opt *)this_01);
  Clara::Parser::~Parser(this_01);
  Clara::Opt::~Opt((Opt *)this_01);
  Clara::Parser::~Parser(this_01);
  Clara::Opt::~Opt((Opt *)this_01);
  Clara::Parser::~Parser(this_01);
  Clara::Opt::~Opt((Opt *)this_01);
  Clara::Parser::~Parser(this_01);
  Clara::Opt::~Opt((Opt *)this_01);
  Clara::Parser::~Parser(this_01);
  Clara::Opt::~Opt((Opt *)this_01);
  Clara::Parser::~Parser(this_01);
  Clara::Opt::~Opt((Opt *)this_01);
  Clara::Parser::~Parser(this_01);
  Clara::Opt::~Opt((Opt *)this_01);
  Clara::Parser::~Parser(this_01);
  Clara::Opt::~Opt((Opt *)this_01);
  Clara::Parser::~Parser(this_01);
  Clara::Opt::~Opt((Opt *)this_01);
  Clara::Parser::~Parser(this_01);
  Clara::Opt::~Opt((Opt *)this_01);
  Clara::Parser::~Parser(this_01);
  Clara::Opt::~Opt((Opt *)this_01);
  Clara::Parser::~Parser(this_01);
  Clara::Opt::~Opt((Opt *)this_01);
  Clara::Parser::~Parser(this_01);
  Clara::Opt::~Opt((Opt *)this_01);
  Clara::Parser::~Parser(this_01);
  Clara::Opt::~Opt((Opt *)this_01);
  Clara::Parser::~Parser(this_01);
  Clara::Help::~Help((Help *)0x17d5ef);
  Clara::ExeName::~ExeName((ExeName *)this_01);
  return in_RDI;
}

Assistant:

Clara::Parser makeCommandLineParser( ConfigData& config ) {

        using namespace Clara;

        auto const setWarning = [&]( std::string const& warning ) {
            if ( warning == "NoAssertions" ) {
                config.warnings = static_cast<WarnAbout::What>(config.warnings | WarnAbout::NoAssertions);
                return ParserResult::ok( ParseResultType::Matched );
            } else if ( warning == "UnmatchedTestSpec" ) {
                config.warnings = static_cast<WarnAbout::What>(config.warnings | WarnAbout::UnmatchedTestSpec);
                return ParserResult::ok( ParseResultType::Matched );
            }

            return ParserResult ::runtimeError(
                "Unrecognised warning option: '" + warning + '\'' );
        };
        auto const loadTestNamesFromFile = [&]( std::string const& filename ) {
                std::ifstream f( filename.c_str() );
                if( !f.is_open() )
                    return ParserResult::runtimeError( "Unable to load input file: '" + filename + '\'' );

                std::string line;
                while( std::getline( f, line ) ) {
                    line = trim(line);
                    if( !line.empty() && !startsWith( line, '#' ) ) {
                        if( !startsWith( line, '"' ) )
                            line = '"' + CATCH_MOVE(line) + '"';
                        config.testsOrTags.push_back( line );
                        config.testsOrTags.emplace_back( "," );
                    }
                }
                //Remove comma in the end
                if(!config.testsOrTags.empty())
                    config.testsOrTags.erase( config.testsOrTags.end()-1 );

                return ParserResult::ok( ParseResultType::Matched );
            };
        auto const setTestOrder = [&]( std::string const& order ) {
                if( startsWith( "declared", order ) )
                    config.runOrder = TestRunOrder::Declared;
                else if( startsWith( "lexical", order ) )
                    config.runOrder = TestRunOrder::LexicographicallySorted;
                else if( startsWith( "random", order ) )
                    config.runOrder = TestRunOrder::Randomized;
                else
                    return ParserResult::runtimeError( "Unrecognised ordering: '" + order + '\'' );
                return ParserResult::ok( ParseResultType::Matched );
            };
        auto const setRngSeed = [&]( std::string const& seed ) {
                if( seed == "time" ) {
                    config.rngSeed = generateRandomSeed(GenerateFrom::Time);
                    return ParserResult::ok(ParseResultType::Matched);
                } else if (seed == "random-device") {
                    config.rngSeed = generateRandomSeed(GenerateFrom::RandomDevice);
                    return ParserResult::ok(ParseResultType::Matched);
                }

                // TODO: ideally we should be parsing uint32_t directly
                //       fix this later when we add new parse overload
                auto parsedSeed = parseUInt( seed, 0 );
                if ( !parsedSeed ) {
                    return ParserResult::runtimeError( "Could not parse '" + seed + "' as seed" );
                }
                config.rngSeed = *parsedSeed;
                return ParserResult::ok( ParseResultType::Matched );
            };
        auto const setDefaultColourMode = [&]( std::string const& colourMode ) {
            Optional<ColourMode> maybeMode = Catch::Detail::stringToColourMode(toLower( colourMode ));
            if ( !maybeMode ) {
                return ParserResult::runtimeError(
                    "colour mode must be one of: default, ansi, win32, "
                    "or none. '" +
                    colourMode + "' is not recognised" );
            }
            auto mode = *maybeMode;
            if ( !isColourImplAvailable( mode ) ) {
                return ParserResult::runtimeError(
                    "colour mode '" + colourMode +
                    "' is not supported in this binary" );
            }
            config.defaultColourMode = mode;
            return ParserResult::ok( ParseResultType::Matched );
        };
        auto const setWaitForKeypress = [&]( std::string const& keypress ) {
                auto keypressLc = toLower( keypress );
                if (keypressLc == "never")
                    config.waitForKeypress = WaitForKeypress::Never;
                else if( keypressLc == "start" )
                    config.waitForKeypress = WaitForKeypress::BeforeStart;
                else if( keypressLc == "exit" )
                    config.waitForKeypress = WaitForKeypress::BeforeExit;
                else if( keypressLc == "both" )
                    config.waitForKeypress = WaitForKeypress::BeforeStartAndExit;
                else
                    return ParserResult::runtimeError( "keypress argument must be one of: never, start, exit or both. '" + keypress + "' not recognised" );
            return ParserResult::ok( ParseResultType::Matched );
            };
        auto const setVerbosity = [&]( std::string const& verbosity ) {
            auto lcVerbosity = toLower( verbosity );
            if( lcVerbosity == "quiet" )
                config.verbosity = Verbosity::Quiet;
            else if( lcVerbosity == "normal" )
                config.verbosity = Verbosity::Normal;
            else if( lcVerbosity == "high" )
                config.verbosity = Verbosity::High;
            else
                return ParserResult::runtimeError( "Unrecognised verbosity, '" + verbosity + '\'' );
            return ParserResult::ok( ParseResultType::Matched );
        };
        auto const setReporter = [&]( std::string const& userReporterSpec ) {
            if ( userReporterSpec.empty() ) {
                return ParserResult::runtimeError( "Received empty reporter spec." );
            }

            Optional<ReporterSpec> parsed =
                parseReporterSpec( userReporterSpec );
            if ( !parsed ) {
                return ParserResult::runtimeError(
                    "Could not parse reporter spec '" + userReporterSpec +
                    "'" );
            }

            auto const& reporterSpec = *parsed;

            auto const& factories =
                getRegistryHub().getReporterRegistry().getFactories();
            auto result = factories.find( reporterSpec.name() );

            if ( result == factories.end() ) {
                return ParserResult::runtimeError(
                    "Unrecognized reporter, '" + reporterSpec.name() +
                    "'. Check available with --list-reporters" );
            }


            const bool hadOutputFile = reporterSpec.outputFile().some();
            config.reporterSpecifications.push_back( CATCH_MOVE( *parsed ) );
            // It would be enough to check this only once at the very end, but
            // there is  not a place where we could call this check, so do it
            // every time it could fail. For valid inputs, this is still called
            // at most once.
            if (!hadOutputFile) {
                int n_reporters_without_file = 0;
                for (auto const& spec : config.reporterSpecifications) {
                    if (spec.outputFile().none()) {
                        n_reporters_without_file++;
                    }
                }
                if (n_reporters_without_file > 1) {
                    return ParserResult::runtimeError( "Only one reporter may have unspecified output file." );
                }
            }

            return ParserResult::ok( ParseResultType::Matched );
        };
        auto const setShardCount = [&]( std::string const& shardCount ) {
            auto parsedCount = parseUInt( shardCount );
            if ( !parsedCount ) {
                return ParserResult::runtimeError(
                    "Could not parse '" + shardCount + "' as shard count" );
            }
            if ( *parsedCount == 0 ) {
                return ParserResult::runtimeError(
                    "Shard count must be positive" );
            }
            config.shardCount = *parsedCount;
            return ParserResult::ok( ParseResultType::Matched );
        };

        auto const setShardIndex = [&](std::string const& shardIndex) {
            auto parsedIndex = parseUInt( shardIndex );
            if ( !parsedIndex ) {
                return ParserResult::runtimeError(
                    "Could not parse '" + shardIndex + "' as shard index" );
            }
            config.shardIndex = *parsedIndex;
            return ParserResult::ok( ParseResultType::Matched );
        };

        auto cli
            = ExeName( config.processName )
            | Help( config.showHelp )
            | Opt( config.showSuccessfulTests )
                ["-s"]["--success"]
                ( "include successful tests in output" )
            | Opt( config.shouldDebugBreak )
                ["-b"]["--break"]
                ( "break into debugger on failure" )
            | Opt( config.noThrow )
                ["-e"]["--nothrow"]
                ( "skip exception tests" )
            | Opt( config.showInvisibles )
                ["-i"]["--invisibles"]
                ( "show invisibles (tabs, newlines)" )
            | Opt( config.defaultOutputFilename, "filename" )
                ["-o"]["--out"]
                ( "default output filename" )
            | Opt( accept_many, setReporter, "name[::key=value]*" )
                ["-r"]["--reporter"]
                ( "reporter to use (defaults to console)" )
            | Opt( config.name, "name" )
                ["-n"]["--name"]
                ( "suite name" )
            | Opt( [&]( bool ){ config.abortAfter = 1; } )
                ["-a"]["--abort"]
                ( "abort at first failure" )
            | Opt( [&]( int x ){ config.abortAfter = x; }, "no. failures" )
                ["-x"]["--abortx"]
                ( "abort after x failures" )
            | Opt( accept_many, setWarning, "warning name" )
                ["-w"]["--warn"]
                ( "enable warnings" )
            | Opt( [&]( bool flag ) { config.showDurations = flag ? ShowDurations::Always : ShowDurations::Never; }, "yes|no" )
                ["-d"]["--durations"]
                ( "show test durations" )
            | Opt( config.minDuration, "seconds" )
                ["-D"]["--min-duration"]
                ( "show test durations for tests taking at least the given number of seconds" )
            | Opt( loadTestNamesFromFile, "filename" )
                ["-f"]["--input-file"]
                ( "load test names to run from a file" )
            | Opt( config.filenamesAsTags )
                ["-#"]["--filenames-as-tags"]
                ( "adds a tag for the filename" )
            | Opt( config.sectionsToRun, "section name" )
                ["-c"]["--section"]
                ( "specify section to run" )
            | Opt( setVerbosity, "quiet|normal|high" )
                ["-v"]["--verbosity"]
                ( "set output verbosity" )
            | Opt( config.listTests )
                ["--list-tests"]
                ( "list all/matching test cases" )
            | Opt( config.listTags )
                ["--list-tags"]
                ( "list all/matching tags" )
            | Opt( config.listReporters )
                ["--list-reporters"]
                ( "list all available reporters" )
            | Opt( config.listListeners )
                ["--list-listeners"]
                ( "list all listeners" )
            | Opt( setTestOrder, "decl|lex|rand" )
                ["--order"]
                ( "test case order (defaults to decl)" )
            | Opt( setRngSeed, "'time'|'random-device'|number" )
                ["--rng-seed"]
                ( "set a specific seed for random numbers" )
            | Opt( setDefaultColourMode, "ansi|win32|none|default" )
                ["--colour-mode"]
                ( "what color mode should be used as default" )
            | Opt( config.libIdentify )
                ["--libidentify"]
                ( "report name and version according to libidentify standard" )
            | Opt( setWaitForKeypress, "never|start|exit|both" )
                ["--wait-for-keypress"]
                ( "waits for a keypress before exiting" )
            | Opt( config.skipBenchmarks)
                ["--skip-benchmarks"]
                ( "disable running benchmarks")
            | Opt( config.benchmarkSamples, "samples" )
                ["--benchmark-samples"]
                ( "number of samples to collect (default: 100)" )
            | Opt( config.benchmarkResamples, "resamples" )
                ["--benchmark-resamples"]
                ( "number of resamples for the bootstrap (default: 100000)" )
            | Opt( config.benchmarkConfidenceInterval, "confidence interval" )
                ["--benchmark-confidence-interval"]
                ( "confidence interval for the bootstrap (between 0 and 1, default: 0.95)" )
            | Opt( config.benchmarkNoAnalysis )
                ["--benchmark-no-analysis"]
                ( "perform only measurements; do not perform any analysis" )
            | Opt( config.benchmarkWarmupTime, "benchmarkWarmupTime" )
                ["--benchmark-warmup-time"]
                ( "amount of time in milliseconds spent on warming up each test (default: 100)" )
            | Opt( setShardCount, "shard count" )
                ["--shard-count"]
                ( "split the tests to execute into this many groups" )
            | Opt( setShardIndex, "shard index" )
                ["--shard-index"]
                ( "index of the group of tests to execute (see --shard-count)" )
            | Opt( config.allowZeroTests )
                ["--allow-running-no-tests"]
                ( "Treat 'No tests run' as a success" )
            | Arg( config.testsOrTags, "test name|pattern|tags" )
                ( "which test or tests to use" );

        return cli;
    }